

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

Maybe<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::Exception::getDetail
          (Maybe<kj::ArrayPtr<const_unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  Detail *pDVar1;
  DetailTypeId DVar2;
  uchar *puVar3;
  size_t sVar4;
  Detail *pDVar5;
  bool bVar6;
  
  pDVar5 = (this->details).builder.ptr;
  pDVar1 = (this->details).builder.pos;
  bVar6 = pDVar5 == pDVar1;
  if (!bVar6) {
    DVar2 = pDVar5->id;
    while (DVar2 != typeId) {
      pDVar5 = pDVar5 + 1;
      bVar6 = pDVar5 == pDVar1;
      if (bVar6) goto LAB_001ce633;
      DVar2 = pDVar5->id;
    }
    puVar3 = (pDVar5->value).ptr;
    sVar4 = (pDVar5->value).size_;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = puVar3;
    (__return_storage_ptr__->ptr).field_1.value.size_ = sVar4;
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_001ce633:
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::ArrayPtr<const byte>> Exception::getDetail(DetailTypeId typeId) const {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      return detail.value.asPtr();
    }
  }
  return kj::none;
}